

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DwaCompressor::setupChannelData(DwaCompressor *this,int minX,int minY,int maxX,int maxY)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_type sVar4;
  reference pvVar5;
  long in_RDI;
  int byte;
  ChannelData *cd;
  uint chan;
  int i;
  char *planarUncBuffer [3];
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  PixelType in_stack_ffffffffffffff94;
  int local_4c;
  uint local_40;
  int local_3c;
  long alStack_38 [7];
  
  for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
    alStack_38[local_3c] = 0;
    if (*(long *)(in_RDI + 0xe8 + (long)local_3c * 8) != 0) {
      alStack_38[local_3c] = *(long *)(in_RDI + 0xe8 + (long)local_3c * 8);
    }
  }
  local_40 = 0;
  while( true ) {
    sVar4 = std::
            vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60));
    if (sVar4 <= local_40) break;
    pvVar5 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                           *)(in_RDI + 0x60),(ulong)local_40);
    iVar2 = numSamples(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
    pvVar5->width = iVar2;
    iVar2 = numSamples(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c
                      );
    pvVar5->height = iVar2;
    iVar2 = pvVar5->width;
    iVar1 = pvVar5->height;
    iVar3 = pixelTypeSize(in_stack_ffffffffffffff94);
    pvVar5->planarUncSize = iVar2 * iVar1 * iVar3;
    pvVar5->planarUncBuffer = (char *)alStack_38[pvVar5->compression];
    pvVar5->planarUncBufferEnd = pvVar5->planarUncBuffer;
    pvVar5->planarUncRle[0] = pvVar5->planarUncBuffer;
    pvVar5->planarUncRleEnd[0] = pvVar5->planarUncRle[0];
    local_4c = 1;
    while( true ) {
      iVar2 = pixelTypeSize(in_stack_ffffffffffffff94);
      if (iVar2 <= local_4c) break;
      pvVar5->planarUncRle[local_4c] =
           pvVar5->planarUncRle[local_4c + -1] + pvVar5->width * pvVar5->height;
      pvVar5->planarUncRleEnd[local_4c] = pvVar5->planarUncRle[local_4c];
      local_4c = local_4c + 1;
    }
    pvVar5->planarUncType = pvVar5->type;
    if (pvVar5->compression == LOSSY_DCT) {
      pvVar5->planarUncType = FLOAT;
    }
    else {
      in_stack_ffffffffffffff94 = pvVar5->width * pvVar5->height;
      iVar2 = pixelTypeSize(in_stack_ffffffffffffff94);
      alStack_38[pvVar5->compression] =
           alStack_38[pvVar5->compression] + (long)(int)(in_stack_ffffffffffffff94 * iVar2);
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void
DwaCompressor::setupChannelData (int minX, int minY, int maxX, int maxY)
{
    char *planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i=0; i<NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (_planarUncBuffer[i])
            planarUncBuffer[i] =  _planarUncBuffer[i];
    }

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        ChannelData *cd = &_channelData[chan];

        cd->width  = OPENEXR_IMF_NAMESPACE::numSamples (cd->xSampling, minX, maxX);
        cd->height = OPENEXR_IMF_NAMESPACE::numSamples (cd->ySampling, minY, maxY);
                                
        cd->planarUncSize =
            cd->width * cd->height * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
                                  
        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        for (int byte = 1; byte < OPENEXR_IMF_NAMESPACE::pixelTypeSize(cd->type); ++byte)
        {
            cd->planarUncRle[byte] = 
                         cd->planarUncRle[byte-1] + cd->width * cd->height;

            cd->planarUncRleEnd[byte] =
                         cd->planarUncRle[byte];
        }

        cd->planarUncType = cd->type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = FLOAT;
        }
        else
        {
            planarUncBuffer[cd->compression] +=
                cd->width * cd->height * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->planarUncType);
        }
    }
}